

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::format<long,long,long,long>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,long *args,long *args_1,
          long *args_2,long *args_3)

{
  ostringstream oss;
  undefined1 auStack_218 [376];
  FormatArg *local_a0;
  undefined4 local_98;
  FormatArg local_90;
  long *local_78;
  code *local_70;
  code *local_68;
  long *local_60;
  code *local_58;
  code *local_50;
  long *local_48;
  code *local_40;
  code *local_38;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_218);
  local_a0 = &local_90;
  local_98 = 4;
  local_90.m_formatImpl = detail::FormatArg::formatImpl<long>;
  local_90.m_toIntImpl = detail::FormatArg::toIntImpl<long>;
  local_70 = detail::FormatArg::formatImpl<long>;
  local_68 = detail::FormatArg::toIntImpl<long>;
  local_58 = detail::FormatArg::formatImpl<long>;
  local_50 = detail::FormatArg::toIntImpl<long>;
  local_40 = detail::FormatArg::formatImpl<long>;
  local_38 = detail::FormatArg::toIntImpl<long>;
  local_90.m_value = fmt;
  local_78 = args;
  local_60 = args_1;
  local_48 = args_2;
  detail::formatImpl((ostream *)auStack_218,(char *)this,local_a0,4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_218);
  std::ios_base::~ios_base((ios_base *)(auStack_218 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}